

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optCompare_optEmptyValue_Test::~optCompare_optEmptyValue_Test(optCompare_optEmptyValue_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(optCompare, optEmptyValue)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i;
  EXPECT_FALSE(i == 1);
  EXPECT_TRUE(i != 1);
  EXPECT_TRUE(i < 1);
  EXPECT_FALSE(i > 1);
  EXPECT_TRUE(i <= 1);
  EXPECT_FALSE(i >= 1);
}